

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s3tmat_io.c
# Opt level: O0

int s3tmat_write(char *fn,float32 ***tmat,uint32 n_tmat,uint32 n_state)

{
  int iVar1;
  int32 iVar2;
  undefined8 in_stack_ffffffffffffffa8;
  uint32 *chksum_00;
  undefined4 uVar3;
  uint local_44;
  uint local_40;
  int j;
  int i;
  int t;
  uint32 ignore;
  uint32 chksum;
  FILE *fp;
  uint32 n_state_local;
  uint32 n_tmat_local;
  float32 ***tmat_local;
  char *fn_local;
  
  t = 0;
  i = 0;
  fp._0_4_ = n_state;
  fp._4_4_ = n_tmat;
  _n_state_local = tmat;
  tmat_local = (float32 ***)fn;
  s3clr_fattr();
  s3add_fattr("version","1.0",1);
  s3add_fattr("chksum0","yes",1);
  _ignore = s3open((char *)tmat_local,"wb",(uint32 *)0x0);
  if (_ignore == (FILE *)0x0) {
    fn_local._4_4_ = -1;
  }
  else {
    for (j = 0; (uint)j < fp._4_4_; j = j + 1) {
      for (local_40 = 0; local_40 < (uint32)fp - 1; local_40 = local_40 + 1) {
        for (local_44 = 0; local_44 < (uint32)fp; local_44 = local_44 + 1) {
          if ((float)_n_state_local[j][(int)local_40][(int)local_44] <= 0.0 &&
              (float)_n_state_local[j][(int)local_40][(int)local_44] != 0.0) {
            in_stack_ffffffffffffffa8 =
                 CONCAT44((int)((ulong)in_stack_ffffffffffffffa8 >> 0x20),local_44);
            err_msg(ERR_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3tmat_io.c"
                    ,0x93,"tmat[%u][%u][%u] < 0 (%e)\n",
                    (double)(float)_n_state_local[j][(int)local_40][(int)local_44],(ulong)(uint)j,
                    (ulong)local_40,in_stack_ffffffffffffffa8);
          }
        }
      }
    }
    floor_nz_3d(_n_state_local,fp._4_4_,(uint32)fp - 1,(uint32)fp,1.2e-38);
    chksum_00 = (uint32 *)&t;
    iVar1 = bio_fwrite_3d(_n_state_local,4,fp._4_4_,(uint32)fp - 1,(uint32)fp,_ignore,chksum_00);
    uVar3 = (undefined4)((ulong)chksum_00 >> 0x20);
    if (iVar1 < 0) {
      s3close(_ignore);
      fn_local._4_4_ = -1;
    }
    else {
      iVar2 = bio_fwrite(&t,4,1,_ignore,0,(uint32 *)&i);
      if (iVar2 == 1) {
        s3close(_ignore);
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3tmat_io.c"
                ,0xb0,"Wrote %s [%ux%ux%u array]\n",tmat_local,(ulong)fp._4_4_,
                CONCAT44(uVar3,(uint32)fp - 1),(uint32)fp);
        fn_local._4_4_ = 0;
      }
      else {
        s3close(_ignore);
        fn_local._4_4_ = -1;
      }
    }
  }
  return fn_local._4_4_;
}

Assistant:

int
s3tmat_write(const char *fn,
	     float32 ***tmat,
	     uint32 n_tmat,
	     uint32 n_state)
{
    FILE *fp;
    uint32 chksum = 0;
    uint32 ignore = 0;
    int t, i, j;
    
    s3clr_fattr();
    s3add_fattr("version", TMAT_FILE_VERSION, TRUE);
    s3add_fattr("chksum0", "yes", TRUE);

    fp = s3open(fn, "wb", NULL);
    if (fp == NULL)
	return S3_ERROR;

    for (t = 0; t < n_tmat; t++) {
	for (i = 0; i < n_state-1; i++) {
	    for (j = 0; j < n_state; j++) {
		if (tmat[t][i][j] < 0) {
		    E_ERROR("tmat[%u][%u][%u] < 0 (%e)\n",
			    t, i, j, tmat[t][i][j]);
		}
	    }
	}
    }

    /* floor all non-zero entries to this value to make sure
       that results are compatible between machines */
    floor_nz_3d(tmat, n_tmat, n_state-1, n_state, MIN_POS_FLOAT32);

    if (bio_fwrite_3d((void ***)tmat,
		   sizeof(float32),
		   n_tmat,
		   n_state-1,
		   n_state,
		   fp,
		   &chksum) < 0) {
	s3close(fp);

	return S3_ERROR;
    }
    if (bio_fwrite(&chksum, sizeof(uint32), 1, fp, 0, &ignore) != 1) {
	s3close(fp);
	return S3_ERROR;
    }

    s3close(fp);

    E_INFO("Wrote %s [%ux%ux%u array]\n",
	   fn, n_tmat, n_state-1, n_state);

    return S3_SUCCESS;
}